

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O3

bool __thiscall
MipsParser::parseRegisterNumber
          (MipsParser *this,Parser *parser,MipsRegisterValue *dest,int numValues)

{
  Token *pTVar1;
  string local_70;
  long local_50;
  Identifier local_48;
  
  pTVar1 = Tokenizer::peekToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  if ((pTVar1->type != Dollar) ||
     (pTVar1 = Tokenizer::peekToken
                         ((parser->entries).
                          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,1),
     pTVar1->type != Integer)) {
    return false;
  }
  if (*(__index_type *)
       ((long)&(pTVar1->value).
               super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
       + 0x20) == '\x01') {
    local_50 = *(long *)&(pTVar1->value).
                         super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                         .
                         super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                         .
                         super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                         .
                         super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                         .
                         super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                         .
                         super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                         ._M_u;
    if (numValues <= local_50) {
      return false;
    }
    tinyformat::format<long>(&local_70,"$%d",&local_50);
    Identifier::Identifier(&local_48,&local_70);
    std::__cxx11::string::operator=((string *)&dest->name,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._name._M_dataplus._M_p != &local_48._name.field_2) {
      operator_delete(local_48._name._M_dataplus._M_p,
                      local_48._name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (*(__index_type *)
         ((long)&(pTVar1->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) == '\x01') {
      dest->num = *(int *)&(pTVar1->value).
                           super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           ._M_u;
      Tokenizer::eatTokens
                ((parser->entries).
                 super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].tokenizer,2);
      return true;
    }
  }
  __assert_fail("std::holds_alternative<int64_t>(value)",
                "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                ,0x59,"int64_t Token::intValue() const");
}

Assistant:

bool MipsParser::parseRegisterNumber(Parser& parser, MipsRegisterValue& dest, int numValues)
{
	// check for $0 and $1
	if (parser.peekToken().type == TokenType::Dollar)
	{
		const Token& number = parser.peekToken(1);
		if (number.type == TokenType::Integer && number.intValue() < numValues)
		{
			dest.name = Identifier(tfm::format("$%d", number.intValue()));
			dest.num = (int) number.intValue();

			parser.eatTokens(2);
			return true;
		}
	}

	return false;
}